

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

void __thiscall
GEO::KdTree::get_minmax
          (KdTree *this,index_t b,index_t e,coord_index_t coord,double *minval,double *maxval)

{
  index_t iVar1;
  pointer puVar2;
  double *pdVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  *minval = 1.79769313486232e+308;
  *maxval = -1.79769313486232e+308;
  puVar2 = (this->point_index_).
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar1 = (this->super_NearestNeighborSearch).stride_;
  pdVar3 = (this->super_NearestNeighborSearch).points_;
  for (uVar4 = (ulong)b; uVar4 < e; uVar4 = uVar4 + 1) {
    dVar5 = *(double *)
             ((long)pdVar3 +
             (ulong)(puVar2[uVar4] * iVar1) * 8 +
             (ulong)(uint)((int)CONCAT71(in_register_00000009,coord) << 3));
    dVar6 = dVar5;
    if (*minval <= dVar5) {
      dVar6 = *minval;
    }
    *minval = dVar6;
    if (dVar5 <= *maxval) {
      dVar5 = *maxval;
    }
    *maxval = dVar5;
  }
  return;
}

Assistant:

void get_minmax(
	    index_t b, index_t e, coord_index_t coord,
	    double& minval, double& maxval
	) const {
	    minval = Numeric::max_float64();
	    maxval = Numeric::min_float64();
	    for(index_t i = b; i < e; ++i) {
		double val = point_ptr(point_index_[i])[coord];
		minval = std::min(minval, val);
		maxval = std::max(maxval, val);
	    }
	}